

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *
kj::tryParseHttpMethodAllowingConnect
          (Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *__return_storage_ptr__,
          StringPtr name)

{
  Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> result;
  char *ptr;
  Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> local_30;
  char *local_18;
  
  local_18 = name.content.ptr;
  consumeHttpMethod(&local_30,&local_18);
  if (*local_18 == '\0') {
    (__return_storage_ptr__->ptr).isSet = local_30.ptr.isSet;
    if ((local_30.ptr.isSet == true) &&
       ((__return_storage_ptr__->ptr).field_1.value.tag = local_30.ptr.field_1.value.tag,
       local_30.ptr.field_1.value.tag == 1)) {
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = local_30.ptr.field_1._8_4_
      ;
    }
  }
  else {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::OneOf<HttpMethod, HttpConnectMethod>> tryParseHttpMethodAllowingConnect(
    kj::StringPtr name) {
  // const_cast OK because we don't actually access it. consumeHttpMethod() is also called by some
  // code later than explicitly needs to use a non-const pointer.
  char* ptr = const_cast<char*>(name.begin());
  auto result = consumeHttpMethod(ptr);
  if (*ptr == '\0') {
    return result;
  } else {
    return kj::none;
  }
}